

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall Args::CmdLine::CmdLine(CmdLine *this,int argc,char **argv,CmdLineOpts opt)

{
  undefined4 in_ECX;
  undefined4 in_ESI;
  API<Args::CmdLine,_Args::CmdLine,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_true>
  *in_RDI;
  ContextInternal *in_stack_ffffffffffffff98;
  undefined **this_00;
  API<Args::CmdLine,_Args::CmdLine,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_true>
  *this_01;
  undefined4 in_stack_fffffffffffffff0;
  API<Args::CmdLine,_Args::CmdLine,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_true>
  *pAVar1;
  
  this_00 = &PTR__CmdLine_001bd578;
  in_RDI->_vptr_API = (_func_int **)&PTR__CmdLine_001bd578;
  pAVar1 = in_RDI;
  details::
  API<Args::CmdLine,_Args::CmdLine,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_true>
  ::API(in_RDI,(CmdLine *)in_RDI,(CmdLine *)in_RDI);
  in_RDI->_vptr_API = (_func_int **)this_00;
  this_01 = in_RDI + 1;
  details::makeContext_abi_cxx11_
            ((int)((ulong)pAVar1 >> 0x20),(char **)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  Context::Context((Context *)this_00,in_stack_ffffffffffffff98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::vector((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
            *)0x15942e);
  in_RDI[3].m_parent = (CmdLine *)0x0;
  in_RDI[3].m_self = (CmdLine *)0x0;
  std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::vector
            ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)0x15944c);
  *(undefined4 *)&in_RDI[5]._vptr_API = in_ECX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x159464);
  std::__cxx11::string::string((string *)&in_RDI[6].m_parent);
  return;
}

Assistant:

CmdLine::CmdLine( int argc, const char * const * argv, CmdLineOpts opt )
#endif
	:	details::API< CmdLine, CmdLine, ArgPtr, true > ( *this, *this )
	,	m_context( details::makeContext( argc, argv ) )
	,	m_command( nullptr )
	,	m_currCommand( nullptr )
	,	m_opt( opt )
{
}